

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O2

void gena_process_subscription_request(SOCKINFO *info,http_message_t *request)

{
  Upnp_FunPtr p_Var1;
  subscription *psVar2;
  int iVar3;
  Upnp_Handle_Type UVar4;
  parse_status_t pVar5;
  uint uVar6;
  int iVar7;
  UpnpSubscriptionRequest *p;
  http_header_t *phVar8;
  char *pcVar9;
  subscription *psVar10;
  char *__dest;
  uri_type *__ptr;
  time_t tVar11;
  long lVar12;
  time_t tVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  int time_out;
  subscription *local_1a8;
  ulong local_1a0;
  char *local_198;
  ulong local_190;
  Handle_Info *handle_info;
  service_info *service;
  ulong local_178;
  size_t local_170;
  URL_list *local_168;
  long local_160;
  char **local_158;
  memptr timeout_hdr;
  UpnpDevice_Handle device_handle;
  memptr callback_hdr;
  memptr nt_hdr;
  uuid_upnp uid;
  Upnp_SID temp_sid;
  size_t local_c0;
  
  p = UpnpSubscriptionRequest_new();
  time_out = 0x709;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x548,"Subscription Request Received:\n")
  ;
  phVar8 = httpmsg_find_hdr(request,0xe,&nt_hdr);
  if (phVar8 == (http_header_t *)0x0) {
LAB_00116dc2:
    iVar3 = 400;
  }
  else {
    iVar3 = memptr_cmp_nocase(&nt_hdr,"upnp:event");
    if (iVar3 == 0) {
      phVar8 = httpmsg_find_hdr(request,0x12,(memptr *)0x0);
      if (phVar8 != (http_header_t *)0x0) goto LAB_00116dc2;
      pcVar9 = str_alloc((request->uri).pathquery.buff,(request->uri).pathquery.size);
      if (pcVar9 != (char *)0x0) {
        iVar3 = 2;
        UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x569,
                   "SubscriptionRequest for event URL path: %s\n",pcVar9);
        HandleLock((char *)0x56d,iVar3);
        UVar4 = GetDeviceHandleInfoForPath
                          (pcVar9,(uint)(info->foreign_sockaddr).ss_family,&device_handle,
                           &handle_info,&service);
        free(pcVar9);
        if (UVar4 == HND_DEVICE) {
          if ((service == (service_info *)0x0) || (service->active == 0)) {
            iVar3 = 0x194;
            error_respond(info,0x194,request);
            pcVar9 = (char *)0x57d;
          }
          else {
            UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x584,
                       "Subscription Request: Number of Subscriptions already %d\n Max Subscriptions allowed: %d\n"
                       ,(ulong)(uint)service->TotalSubscriptions,handle_info->MaxSubscriptions);
            if ((handle_info->MaxSubscriptions == -1) ||
               (service->TotalSubscriptions < handle_info->MaxSubscriptions)) {
              psVar10 = (subscription *)malloc(0xc0);
              if (psVar10 == (subscription *)0x0) {
                iVar3 = 500;
                error_respond(info,500,request);
                pcVar9 = (char *)0x595;
              }
              else {
                psVar10->ToSendEventKey = 0;
                psVar10->active = 0;
                psVar10->next = (SUBSCRIPTION *)0x0;
                (psVar10->DeliveryURLs).size = 0;
                (psVar10->DeliveryURLs).URLs = (char *)0x0;
                (psVar10->DeliveryURLs).parsedURLs = (uri_type *)0x0;
                iVar3 = ListInit(&psVar10->outgoing,(cmp_routine)0x0,free);
                if (iVar3 == 0) {
                  phVar8 = httpmsg_find_hdr(request,2,&callback_hdr);
                  if (phVar8 != (http_header_t *)0x0) {
                    local_168 = &psVar10->DeliveryURLs;
                    local_158 = &(psVar10->DeliveryURLs).URLs;
                    local_170 = callback_hdr.length + 1;
                    (psVar10->DeliveryURLs).parsedURLs = (uri_type *)0x0;
                    local_168->size = 0;
                    (psVar10->DeliveryURLs).URLs = (char *)0x0;
                    local_190 = 0;
                    uVar14 = 0;
                    local_198 = callback_hdr.buf;
                    local_1a0 = callback_hdr.length;
                    local_1a8 = psVar10;
LAB_00117008:
                    sVar17 = local_170 - uVar14;
                    pcVar9 = local_198;
                    uVar15 = local_1a0;
                    do {
                      uVar16 = local_190;
                      if (uVar15 == uVar14) {
                        if (local_190 == 0) {
                          local_168->size = 0;
                          goto LAB_0011712f;
                        }
                        __dest = (char *)malloc(local_170);
                        psVar10 = local_1a8;
                        (local_1a8->DeliveryURLs).URLs = __dest;
                        __ptr = (uri_type *)malloc(uVar16 * 0xd0);
                        pcVar9 = local_198;
                        uVar14 = local_1a0;
                        (psVar10->DeliveryURLs).parsedURLs = __ptr;
                        if (__dest == (char *)0x0 || __ptr == (uri_type *)0x0) {
                          free(__dest);
                          goto LAB_001170cd;
                        }
                        memcpy(__dest,local_198,local_1a0);
                        __dest[uVar14] = '\0';
                        local_178 = 0;
                        uVar15 = 0;
                        goto LAB_0011717e;
                      }
                      if ((uVar14 + 1 < uVar15) && (pcVar9[uVar14] == '<')) {
                        iVar3 = parse_uri(pcVar9 + uVar14 + 1,sVar17,(uri_type *)temp_sid);
                        if ((iVar3 == 1) && (local_c0 != 0)) goto LAB_00117061;
                        pcVar9 = local_198;
                        uVar15 = local_1a0;
                        if (iVar3 == -0x68) goto LAB_001170e0;
                      }
                      sVar17 = sVar17 - 1;
                      uVar14 = uVar14 + 1;
                    } while( true );
                  }
                  iVar3 = 0x19c;
                  error_respond(info,0x19c,request);
                  freeSubscriptionList(psVar10);
                  pcVar9 = (char *)0x5a8;
                }
                else {
                  iVar3 = 500;
                  error_respond(info,500,request);
                  pcVar9 = (char *)0x5a0;
                }
              }
            }
            else {
              iVar3 = 500;
              error_respond(info,500,request);
              pcVar9 = (char *)0x58e;
            }
          }
        }
        else {
          iVar3 = 500;
          error_respond(info,500,request);
          pcVar9 = (char *)0x576;
        }
        goto LAB_00116f63;
      }
      iVar3 = 500;
    }
    else {
      iVar3 = 0x19c;
    }
  }
  error_respond(info,iVar3,request);
LAB_00116dd2:
  UpnpSubscriptionRequest_delete(p);
  return;
LAB_0011717e:
  do {
    sVar17 = local_170 - uVar15;
    lVar12 = local_178 * 0xd0;
    uVar16 = uVar15;
    local_160 = lVar12;
LAB_00117197:
    psVar10 = local_1a8;
    uVar15 = uVar16 + 1;
    if (sVar17 == 1) break;
    if ((uVar14 <= uVar15) || (pcVar9[uVar16] != '<')) goto LAB_00117202;
    iVar3 = parse_uri((local_1a8->DeliveryURLs).URLs + uVar15,sVar17,
                      (uri_type *)
                      ((((local_1a8->DeliveryURLs).parsedURLs)->hostport).IPaddress.__ss_padding +
                      lVar12 + -0x52));
    psVar2 = local_1a8;
    uVar14 = local_1a0;
    pcVar9 = local_198;
    lVar12 = local_160;
    if (iVar3 != 1) {
      if (iVar3 != -0x68) goto LAB_00117202;
      free((local_1a8->DeliveryURLs).URLs);
      __ptr = (psVar2->DeliveryURLs).parsedURLs;
LAB_001170cd:
      free(__ptr);
      *local_158 = (char *)0x0;
      local_158[1] = (char *)0x0;
      goto LAB_001170e0;
    }
    if (*(long *)((((psVar10->DeliveryURLs).parsedURLs)->hostport).IPaddress.__ss_padding +
                 local_160 + -10) == 0) goto LAB_00117202;
    local_178 = local_178 + 1;
  } while (local_178 < local_190);
  local_168->size = local_190;
  if ((int)local_190 == -0x68) {
LAB_001170e0:
    iVar3 = 500;
    error_respond(info,500,request);
    freeSubscriptionList(local_1a8);
    pcVar9 = (char *)0x5b5;
  }
  else if ((int)local_190 == 0) {
LAB_0011712f:
    iVar3 = 0x19c;
    error_respond(info,0x19c,request);
    freeSubscriptionList(local_1a8);
    pcVar9 = (char *)0x5af;
  }
  else {
    iVar3 = gena_validate_delivery_urls(info,local_168);
    if (iVar3 == 0) {
      phVar8 = httpmsg_find_hdr(request,0x15,&timeout_hdr);
      if (phVar8 != (http_header_t *)0x0) {
        pVar5 = matchstr(timeout_hdr.buf,timeout_hdr.length,"%iSecond-%d%0",&time_out);
        if (pVar5 != PARSE_OK) {
          iVar3 = memptr_cmp_nocase(&timeout_hdr,"Second-infinite");
          if (iVar3 == 0) {
            time_out = -1;
          }
          else {
            time_out = 0x709;
          }
        }
      }
      iVar3 = handle_info->MaxSubscriptionTimeOut;
      if ((iVar3 != -1) && (time_out == -1 || iVar3 < time_out)) {
        time_out = iVar3;
      }
      if (time_out < 0) {
        tVar13 = 0;
      }
      else {
        tVar11 = time((time_t *)0x0);
        tVar13 = time_out + tVar11;
      }
      psVar10 = local_1a8;
      local_1a8->expireTime = tVar13;
      uuid_create(&uid);
      upnp_uuid_unpack(&uid,temp_sid);
      iVar3 = 0x2c;
      uVar6 = snprintf(psVar10->sid,0x2c,"uuid:%s",temp_sid);
      if (uVar6 < 0x2c) {
        iVar3 = time_out;
        iVar7 = respond_ok(info,time_out,local_1a8,request);
        psVar10 = local_1a8;
        if (iVar7 == 0) {
          local_1a8->next = service->subscriptionList;
          service->subscriptionList = local_1a8;
          service->TotalSubscriptions = service->TotalSubscriptions + 1;
          UpnpSubscriptionRequest_strcpy_ServiceId(p,service->serviceId);
          UpnpSubscriptionRequest_strcpy_UDN(p,service->UDN);
          UpnpSubscriptionRequest_strcpy_SID(p,psVar10->sid);
          p_Var1 = handle_info->Callback;
          pcVar9 = handle_info->Cookie;
          HandleUnlock((char *)0x5f8,(int)psVar10);
          (*p_Var1)(UPNP_EVENT_SUBSCRIPTION_REQUEST,p,pcVar9);
          goto LAB_00116dd2;
        }
      }
      freeSubscriptionList(local_1a8);
      pcVar9 = (char *)0x5e6;
    }
    else {
      iVar3 = 0x19c;
      error_respond(info,0x19c,request);
      freeSubscriptionList(local_1a8);
      pcVar9 = (char *)0x5bc;
    }
  }
LAB_00116f63:
  HandleUnlock(pcVar9,iVar3);
  goto LAB_00116dd2;
LAB_00117202:
  sVar17 = sVar17 - 1;
  uVar16 = uVar15;
  goto LAB_00117197;
LAB_00117061:
  local_190 = local_190 + 1;
  uVar14 = uVar14 + 1;
  goto LAB_00117008;
}

Assistant:

void gena_process_subscription_request(SOCKINFO *info, http_message_t *request)
{
	UpnpSubscriptionRequest *request_struct = UpnpSubscriptionRequest_new();
	Upnp_SID temp_sid;
	int return_code = 1;
	int time_out = 1801;
	service_info *service;
	subscription *sub;
	uuid_upnp uid;
	struct Handle_Info *handle_info;
	void *cookie;
	Upnp_FunPtr callback_fun;
	UpnpDevice_Handle device_handle;
	memptr nt_hdr;
	char *event_url_path = NULL;
	memptr callback_hdr;
	memptr timeout_hdr;
	int rc = 0;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"Subscription Request Received:\n");

	if (httpmsg_find_hdr(request, HDR_NT, &nt_hdr) == NULL) {
		error_respond(info, HTTP_BAD_REQUEST, request);
		goto exit_function;
	}

	/* check NT header */
	/* Windows Millenium Interoperability: */
	/* we accept either upnp:event, or upnp:propchange for the NT header */
	if (memptr_cmp_nocase(&nt_hdr, "upnp:event") != 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		goto exit_function;
	}

	/* if a SID is present then the we have a bad request "incompatible
	 * headers" */
	if (httpmsg_find_hdr(request, HDR_SID, NULL) != NULL) {
		error_respond(info, HTTP_BAD_REQUEST, request);
		goto exit_function;
	}
	/* look up service by eventURL */
	event_url_path = str_alloc(
		request->uri.pathquery.buff, request->uri.pathquery.size);
	if (event_url_path == NULL) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"SubscriptionRequest for event URL path: %s\n",
		event_url_path);

	HandleLock(__FILE__, __LINE__);

	if (GetDeviceHandleInfoForPath(event_url_path,
		    info->foreign_sockaddr.ss_family,
		    &device_handle,
		    &handle_info,
		    &service) != HND_DEVICE) {
		free(event_url_path);
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	free(event_url_path);

	if (service == NULL || !service->active) {
		error_respond(info, HTTP_NOT_FOUND, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"Subscription Request: Number of Subscriptions already %d\n "
		"Max Subscriptions allowed: %d\n",
		service->TotalSubscriptions,
		handle_info->MaxSubscriptions);

	/* too many subscriptions */
	if (handle_info->MaxSubscriptions != -1 &&
		service->TotalSubscriptions >= handle_info->MaxSubscriptions) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* generate new subscription */
	sub = (subscription *)malloc(sizeof(subscription));
	if (sub == NULL) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	sub->ToSendEventKey = 0;
	sub->active = 0;
	sub->next = NULL;
	sub->DeliveryURLs.size = 0;
	sub->DeliveryURLs.URLs = NULL;
	sub->DeliveryURLs.parsedURLs = NULL;
	if (ListInit(&sub->outgoing, 0, free) != 0) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}

	/* check for valid callbacks */
	if (httpmsg_find_hdr(request, HDR_CALLBACK, &callback_hdr) == NULL) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	return_code = create_url_list(&callback_hdr, &sub->DeliveryURLs);
	if (return_code == 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	if (return_code == UPNP_E_OUTOF_MEMORY) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	return_code = gena_validate_delivery_urls(info, &sub->DeliveryURLs);
	if (return_code != 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* set the timeout */
	if (httpmsg_find_hdr(request, HDR_TIMEOUT, &timeout_hdr) != NULL) {
		if (matchstr(timeout_hdr.buf,
			    timeout_hdr.length,
			    "%iSecond-%d%0",
			    &time_out) == PARSE_OK) {
			/* nothing */
		} else if (memptr_cmp_nocase(&timeout_hdr, "Second-infinite") ==
			   0) {
			/* infinite timeout */
			time_out = -1;
		} else {
			/* default is > 1800 seconds */
			time_out = DEFAULT_TIMEOUT;
		}
	}
	/* replace infinite timeout with max timeout, if possible */
	if (handle_info->MaxSubscriptionTimeOut != -1) {
		if (time_out == -1 ||
			time_out > handle_info->MaxSubscriptionTimeOut) {
			time_out = handle_info->MaxSubscriptionTimeOut;
		}
	}
	if (time_out >= 0) {
		sub->expireTime = time(NULL) + time_out;
	} else {
		/* infinite time */
		sub->expireTime = 0;
	}

	/* generate SID */
	uuid_create(&uid);
	upnp_uuid_unpack(&uid, temp_sid);
	rc = snprintf(sub->sid, sizeof(sub->sid), "uuid:%s", temp_sid);

	/* respond OK */
	if (rc < 0 || (unsigned int)rc >= sizeof(sub->sid) ||
		(respond_ok(info, time_out, sub, request) != UPNP_E_SUCCESS)) {
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* add to subscription list */
	sub->next = service->subscriptionList;
	service->subscriptionList = sub;
	service->TotalSubscriptions++;

	/* finally generate callback for init table dump */
	UpnpSubscriptionRequest_strcpy_ServiceId(
		request_struct, service->serviceId);
	UpnpSubscriptionRequest_strcpy_UDN(request_struct, service->UDN);
	UpnpSubscriptionRequest_strcpy_SID(request_struct, sub->sid);

	/* copy callback */
	callback_fun = handle_info->Callback;
	cookie = handle_info->Cookie;

	HandleUnlock(__FILE__, __LINE__);

	/* make call back with request struct */
	/* in the future should find a way of mainting that the handle */
	/* is not unregistered in the middle of a callback */
	callback_fun(UPNP_EVENT_SUBSCRIPTION_REQUEST, request_struct, cookie);

exit_function:
	UpnpSubscriptionRequest_delete(request_struct);
}